

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

void Saig_TsiStateInsert(Saig_Tsim_t *p,uint *pState,int nWords)

{
  int iVar1;
  int iVar2;
  int Hash;
  int nWords_local;
  uint *pState_local;
  Saig_Tsim_t *p_local;
  
  iVar1 = Saig_TsiStateHash(pState,nWords,p->nBins);
  iVar2 = Saig_TsiStateLookup(p,pState,nWords);
  if (iVar2 == 0) {
    Saig_TsiSetNext(pState,nWords,p->pBins[iVar1]);
    p->pBins[iVar1] = pState;
    return;
  }
  __assert_fail("!Saig_TsiStateLookup( p, pState, nWords )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                ,0x1a4,"void Saig_TsiStateInsert(Saig_Tsim_t *, unsigned int *, int)");
}

Assistant:

void Saig_TsiStateInsert( Saig_Tsim_t * p, unsigned * pState, int nWords )
{
    int Hash = Saig_TsiStateHash( pState, nWords, p->nBins );
    assert( !Saig_TsiStateLookup( p, pState, nWords ) );
    Saig_TsiSetNext( pState, nWords, p->pBins[Hash] );
    p->pBins[Hash] = pState;    
}